

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt_uint32 stbtt__buf_get(stbtt__buf *b,int n)

{
  byte bVar1;
  int local_1c;
  uint local_18;
  int i;
  stbtt_uint32 v;
  int n_local;
  stbtt__buf *b_local;
  
  local_18 = 0;
  if ((0 < n) && (n < 5)) {
    for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
      bVar1 = stbtt__buf_get8(b);
      local_18 = local_18 << 8 | (uint)bVar1;
    }
    return local_18;
  }
  __assert_fail("n >= 1 && n <= 4",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                ,0x48a,"stbtt_uint32 stbtt__buf_get(stbtt__buf *, int)");
}

Assistant:

static stbtt_uint32 stbtt__buf_get(stbtt__buf *b, int n)
{
   stbtt_uint32 v = 0;
   int i;
   STBTT_assert(n >= 1 && n <= 4);
   for (i = 0; i < n; i++)
      v = (v << 8) | stbtt__buf_get8(b);
   return v;
}